

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::detach
          (holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  list *in_stack_00000010;
  
  detach<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>(in_stack_00000010);
  return;
}

Assistant:

void detach() override
			{
				cs_impl::detach(mDat);
			}